

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O2

void __thiscall
Centaurus::ATNPrinter<unsigned_char>::print
          (ATNPrinter<unsigned_char> *this,wostream *os,Identifier *key)

{
  pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  pStack_48;
  
  print_atn_abi_cxx11_(&pStack_48,this,os,0,key);
  std::
  pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  ::~pair(&pStack_48);
  return;
}

Assistant:

void print(std::wostream& os, const Identifier& key)
	{
		print_atn(os, 0, key);
	}